

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  pointer pcVar1;
  size_type sVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  long lVar8;
  long *plVar9;
  long *plVar10;
  size_type *psVar11;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  ulong uVar13;
  char *pcVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *pcVar16;
  string suffix;
  string indent;
  string wrappableInsteadOfChars;
  string wrappableAfterChars;
  string wrappableBeforeChars;
  char *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  char *local_140;
  TextAttributes *local_138;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_130;
  string *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Text *local_100;
  undefined1 *local_f8;
  size_t local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98 = &(this->str).field_2;
  (this->str)._M_dataplus._M_p = (pointer)local_98;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar3 = _attr->indent;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar3;
  (this->attr).width = _attr->width;
  local_130 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50[0] = local_40;
  local_128 = _str;
  local_100 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"[({<\t","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"])}>-,./|\\","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90," \n\r","");
  local_f8 = local_e8;
  if (_attr->initialIndent == 0xffffffffffffffff) {
    std::__cxx11::string::_M_construct((ulong)&local_f8,(char)_attr->indent);
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_f8,(char)_attr->initialIndent);
  }
  if (local_128->_M_string_length != 0) {
    local_168 = (local_128->_M_dataplus)._M_p;
    pcVar16 = local_168 + local_128->_M_string_length;
    local_140 = pcVar16;
    local_138 = _attr;
    do {
      paVar15 = &local_160.field_2;
      local_160._M_dataplus._M_p = (pointer)paVar15;
      if (0x7ce0 < (ulong)((long)(local_100->lines).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_100->lines).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"... message truncated due to excessive size","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_130,&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar15) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        break;
      }
      local_160._M_string_length = 0;
      local_160.field_2._M_local_buf[0] = '\0';
      uVar13 = _attr->width - local_f0;
      if ((ulong)((long)pcVar16 - (long)local_168) <= uVar13) {
        uVar13 = (long)pcVar16 - (long)local_168;
      }
      pcVar1 = (local_128->_M_dataplus)._M_p;
      sVar2 = local_128->_M_string_length;
      local_120._M_dataplus._M_p._0_1_ = 10;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_168,local_168 + uVar13,&local_120);
      pcVar14 = pcVar1 + sVar2;
      if (_Var7._M_current != pcVar16) {
        _Var12 = _Var7;
        bVar5 = false;
        do {
          lVar8 = std::__cxx11::string::find((char)local_70,(ulong)(uint)(int)*_Var7._M_current);
          if (_Var7._M_current == _Var12._M_current || lVar8 == -1) {
            if (local_168 < _Var7._M_current) {
              lVar8 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)*_Var7._M_current)
              ;
              pcVar16 = _Var7._M_current;
              pcVar6 = _Var7._M_current;
              bVar4 = true;
              if (lVar8 != -1) goto LAB_0012e730;
            }
            lVar8 = std::__cxx11::string::find((char)local_90,(ulong)(uint)(int)*_Var7._M_current);
            pcVar16 = _Var12._M_current;
            pcVar6 = pcVar14;
            bVar4 = bVar5;
            if (lVar8 != -1) {
              bVar4 = true;
              pcVar16 = _Var7._M_current;
              pcVar6 = _Var7._M_current + 1;
            }
          }
          else {
            pcVar16 = _Var7._M_current + 1;
            pcVar6 = _Var7._M_current + 1;
            bVar4 = true;
          }
LAB_0012e730:
          pcVar14 = pcVar6;
          _Var12._M_current = pcVar16;
          if (_Var7._M_current == local_168) {
            if (!bVar4) {
              std::__cxx11::string::_M_replace
                        ((ulong)&local_160,0,(char *)local_160._M_string_length,0x14865c);
              _Var7._M_current = _Var12._M_current + -1;
              _attr = local_138;
              pcVar14 = _Var7._M_current;
              pcVar16 = local_140;
              goto LAB_0012e7c2;
            }
            break;
          }
          _Var7._M_current = _Var7._M_current + -1;
          bVar5 = bVar4;
        } while (!bVar4);
        do {
          _Var7._M_current = _Var12._M_current;
          _attr = local_138;
          pcVar16 = local_140;
          if (_Var7._M_current <= local_168) break;
          lVar8 = std::__cxx11::string::find((char)local_90,(ulong)(uint)(int)_Var7._M_current[-1]);
          _attr = local_138;
          _Var12._M_current = _Var7._M_current + -1;
          pcVar16 = local_140;
        } while (lVar8 != -1);
      }
LAB_0012e7c2:
      paVar15 = &local_120.field_2;
      local_d8[0] = local_c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_d8,local_168,_Var7._M_current);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,(ulong)local_f8);
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar9[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar9;
      }
      local_b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)local_160._M_dataplus._M_p);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_120.field_2._M_allocated_capacity = *psVar11;
        local_120.field_2._8_8_ = plVar9[3];
        local_120._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_120.field_2._M_allocated_capacity = *psVar11;
        local_120._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_120._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_130,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar15) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
      if (local_f0 != _attr->indent) {
        local_120._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct((ulong)&local_120,(char)_attr->indent);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar15) {
          operator_delete(local_120._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      local_168 = pcVar14;
    } while (pcVar14 != pcVar16);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            const std::string wrappableBeforeChars = "[({<\t";
            const std::string wrappableAfterChars = "])}>-,./|\\";
            const std::string wrappableInsteadOfChars = " \n\r";
            std::string indent = _attr.initialIndent != std::string::npos
                ? std::string( _attr.initialIndent, ' ' )
                : std::string( _attr.indent, ' ' );

            typedef std::string::const_iterator iterator;
            iterator it = _str.begin();
            const iterator strEnd = _str.end();

            while( it != strEnd ) {

                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }

                std::string suffix;
                std::size_t width = (std::min)( static_cast<size_t>( strEnd-it ), _attr.width-static_cast<size_t>( indent.size() ) );
                iterator itEnd = it+width;
                iterator itNext = _str.end();

                iterator itNewLine = std::find( it, itEnd, '\n' );
                if( itNewLine != itEnd )
                    itEnd = itNewLine;

                if( itEnd != strEnd  ) {
                    bool foundWrapPoint = false;
                    iterator findIt = itEnd;
                    do {
                        if( wrappableAfterChars.find( *findIt ) != std::string::npos && findIt != itEnd ) {
                            itEnd = findIt+1;
                            itNext = findIt+1;
                            foundWrapPoint = true;
                        }
                        else if( findIt > it && wrappableBeforeChars.find( *findIt ) != std::string::npos ) {
                            itEnd = findIt;
                            itNext = findIt;
                            foundWrapPoint = true;
                        }
                        else if( wrappableInsteadOfChars.find( *findIt ) != std::string::npos ) {
                            itNext = findIt+1;
                            itEnd = findIt;
                            foundWrapPoint = true;
                        }
                        if( findIt == it )
                            break;
                        else
                            --findIt;
                    }
                    while( !foundWrapPoint );

                    if( !foundWrapPoint ) {
                        // No good wrap char, so we'll break mid word and add a hyphen
                        --itEnd;
                        itNext = itEnd;
                        suffix = "-";
                    }
                    else {
                        while( itEnd > it && wrappableInsteadOfChars.find( *(itEnd-1) ) != std::string::npos )
                            --itEnd;
                    }
                }
                lines.push_back( indent + std::string( it, itEnd ) + suffix );

                if( indent.size() != _attr.indent )
                    indent = std::string( _attr.indent, ' ' );
                it = itNext;
            }
        }